

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column.h
# Opt level: O2

pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> * __thiscall
winmd::reader::row_base<winmd::reader::TypeDef>::get_list<winmd::reader::MethodDef>
          (pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *__return_storage_ptr__,
          row_base<winmd::reader::TypeDef> *this,uint32_t column)

{
  database *pdVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  row_base<winmd::reader::TypeDef> local_38;
  
  pdVar1 = this->m_table->m_database;
  uVar2 = get_value<unsigned_int>(this,column);
  local_38.m_index = this->m_index + 1;
  if (local_38.m_index < (pdVar1->TypeDef).super_table_base.m_row_count) {
    local_38.m_table = &(pdVar1->TypeDef).super_table_base;
    uVar3 = get_value<unsigned_int>(&local_38,column);
    uVar4 = uVar3 - 1;
  }
  else {
    uVar4 = (pdVar1->MethodDef).super_table_base.m_row_count;
  }
  (__return_storage_ptr__->first).super_row_base<winmd::reader::MethodDef>.m_table =
       &(pdVar1->MethodDef).super_table_base;
  (__return_storage_ptr__->first).super_row_base<winmd::reader::MethodDef>.m_index = uVar2 - 1;
  (__return_storage_ptr__->second).super_row_base<winmd::reader::MethodDef>.m_table =
       &(pdVar1->MethodDef).super_table_base;
  (__return_storage_ptr__->second).super_row_base<winmd::reader::MethodDef>.m_index = uVar4;
  return __return_storage_ptr__;
}

Assistant:

auto row_base<Row>::get_list(uint32_t const column) const
    {
        auto const& my_table = get_database().template get_table<Row>();
        auto const& target_table = get_database().template get_table<T>();

        auto first = target_table.begin() + get_value<uint32_t>(column) - 1;
        auto last = target_table.end();
        if (index() + 1 < my_table.size())
        {
            last = target_table.begin() + my_table[index() + 1].template get_value<uint32_t>(column) - 1;
        }
        return std::pair{ first, last };
    }